

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

adiak_datatype_t *
parse_typestr_helper
          (char *typestr,int typestr_start,int typestr_end,int is_reference,va_list *ap,
          int *new_typestr_start)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ushort **ppuVar6;
  void *pvVar7;
  adiak_datatype_t *paVar8;
  int *piVar9;
  adiak_datatype_t **ppaVar10;
  adiak_datatype_t *paVar11;
  int iVar12;
  char *pcVar13;
  adiak_datatype_t *paVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  va_list *ap_00;
  int iVar18;
  long lVar19;
  bool bVar20;
  int local_58;
  int local_54;
  va_list *local_50;
  int *local_48;
  ulong local_40;
  long local_38;
  
  local_58 = typestr_start;
  if (typestr_start == typestr_end || typestr == (char *)0x0) {
    paVar8 = (adiak_datatype_t *)0x0;
switchD_00107688_caseD_65:
    if (paVar8 != (adiak_datatype_t *)0x0) {
      free_adiak_type(paVar8);
    }
    return (adiak_datatype_t *)0x0;
  }
  local_50 = ap;
  local_48 = new_typestr_start;
  ppuVar6 = __ctype_b_loc();
  uVar16 = (ulong)local_58;
  pcVar13 = typestr + uVar16;
  do {
    do {
      cVar1 = *pcVar13;
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
      pcVar13 = pcVar13 + 1;
    } while ((long)cVar1 == 0x2c);
  } while (((*ppuVar6)[cVar1] & 0x2000) != 0);
  bVar20 = cVar1 == '&';
  local_40 = (ulong)bVar20;
  iVar18 = (bVar20 - 1) + uVar15;
  if (bVar20) {
    is_reference = 1;
  }
  local_38 = (long)iVar18;
  bVar2 = typestr[local_38];
  local_58 = iVar18;
  local_54 = is_reference;
  pvVar7 = memchr("[{<(",(int)(char)bVar2,5);
  if (pvVar7 == (void *)0x0) {
    paVar8 = (adiak_datatype_t *)0x0;
  }
  else {
    paVar8 = (adiak_datatype_t *)malloc(0x20);
    paVar8->dtype = adiak_type_unset;
    paVar8->numerical = adiak_numerical_unset;
    paVar8->num_elements = 0;
    paVar8->num_subtypes = 0;
    paVar8->subtype = (adiak_datatype_t **)0x0;
    paVar8->is_reference = 0;
    paVar8->num_ref_elements = 0;
  }
  if (0x3b < bVar2) {
    if (bVar2 == 0x3c) {
      iVar5 = find_end_brace(typestr,'>',iVar18,typestr_end);
      iVar18 = local_54;
      if (iVar5 == -1) goto switchD_00107688_caseD_65;
      paVar8->dtype = adiak_range;
      paVar8->numerical = adiak_categorical;
      paVar8->is_reference = local_54;
      paVar8->num_elements = (uint)(local_54 == 0) * 2;
      paVar8->num_ref_elements = (uint)(local_54 != 0) * 2;
      paVar8->num_subtypes = 1;
      ppaVar10 = (adiak_datatype_t **)malloc(8);
      paVar8->subtype = ppaVar10;
      iVar17 = (int)local_40;
      ap_00 = local_50;
    }
    else {
      if ((bVar2 != 0x7b) && (bVar2 != 0x5b)) {
        return paVar8;
      }
      iVar5 = find_end_brace(typestr,(bVar2 == 0x7b) << 5 | 0x5d,iVar18,typestr_end);
      ap_00 = local_50;
      iVar18 = local_54;
      if (iVar5 == -1) goto switchD_00107688_caseD_65;
      uVar3 = (*local_50)[0].gp_offset;
      if ((ulong)uVar3 < 0x29) {
        piVar9 = (int *)((ulong)uVar3 + (long)(*local_50)[0].reg_save_area);
        (*local_50)[0].gp_offset = uVar3 + 8;
      }
      else {
        piVar9 = (int *)(*local_50)[0].overflow_arg_area;
        (*local_50)[0].overflow_arg_area = piVar9 + 2;
      }
      iVar17 = *piVar9;
      iVar12 = 0;
      if (local_54 == 0) {
        iVar12 = iVar17;
      }
      paVar8->num_elements = iVar12;
      if (local_54 == 0) {
        iVar17 = 0;
      }
      paVar8->num_ref_elements = iVar17;
      paVar8->dtype = (typestr[local_38] == '{') + adiak_set;
      paVar8->numerical = adiak_categorical;
      paVar8->is_reference = local_54;
      paVar8->num_subtypes = 1;
      ppaVar10 = (adiak_datatype_t **)malloc(8);
      paVar8->subtype = ppaVar10;
      iVar17 = (int)local_40;
    }
    paVar11 = parse_typestr_helper(typestr,iVar17 + uVar15,iVar5,iVar18,ap_00,&local_58);
    *paVar8->subtype = paVar11;
    if (*paVar8->subtype != (adiak_datatype_t *)0x0) {
      *local_48 = iVar5 + 1;
      return paVar8;
    }
    goto switchD_00107688_caseD_65;
  }
  if (bVar2 != 0x25) {
    if (bVar2 != 0x28) {
      return paVar8;
    }
    iVar5 = find_end_brace(typestr,')',iVar18,typestr_end);
    iVar18 = local_54;
    if (iVar5 != -1) {
      paVar8->dtype = adiak_tuple;
      paVar8->numerical = adiak_categorical;
      paVar8->is_reference = local_54;
      uVar3 = (*local_50)[0].gp_offset;
      if ((ulong)uVar3 < 0x29) {
        piVar9 = (int *)((ulong)uVar3 + (long)(*local_50)[0].reg_save_area);
        (*local_50)[0].gp_offset = uVar3 + 8;
      }
      else {
        piVar9 = (int *)(*local_50)[0].overflow_arg_area;
        (*local_50)[0].overflow_arg_area = piVar9 + 2;
      }
      iVar17 = *piVar9;
      iVar12 = iVar17;
      iVar4 = 0;
      if (local_54 == 0) {
        iVar12 = 0;
        iVar4 = iVar17;
      }
      paVar8->num_elements = iVar4;
      paVar8->num_ref_elements = iVar12;
      paVar8->num_subtypes = iVar17;
      ppaVar10 = (adiak_datatype_t **)malloc((long)iVar17 << 3);
      paVar8->subtype = ppaVar10;
      memset(ppaVar10,0,(long)iVar17 << 3);
      local_58 = (int)local_40 + uVar15;
      bVar20 = 0 < paVar8->num_subtypes;
      if (paVar8->num_subtypes < 1) {
        return paVar8;
      }
      paVar11 = parse_typestr_helper(typestr,local_58,iVar5,iVar18,local_50,&local_58);
      *paVar8->subtype = paVar11;
      if (*paVar8->subtype != (adiak_datatype_t *)0x0) {
        lVar19 = 1;
        do {
          bVar20 = lVar19 < paVar8->num_subtypes;
          if (paVar8->num_subtypes <= lVar19) {
            return paVar8;
          }
          paVar11 = parse_typestr_helper(typestr,local_58,iVar5,local_54,local_50,&local_58);
          paVar8->subtype[lVar19] = paVar11;
          ppaVar10 = paVar8->subtype + lVar19;
          lVar19 = lVar19 + 1;
        } while (*ppaVar10 != (adiak_datatype_t *)0x0);
      }
      if (!bVar20) {
        return paVar8;
      }
    }
    goto switchD_00107688_caseD_65;
  }
  iVar18 = (int)local_40;
  local_58 = iVar18 + uVar15;
  if (typestr[local_58] == 'l') {
    local_58 = iVar18 + uVar15 + 1;
    if (typestr[local_58] == 'l') {
      local_58 = iVar18 + uVar15 + 2;
      paVar14 = &base_ulonglong;
      paVar11 = &base_longlong;
    }
    else {
      paVar14 = &base_ulong;
      paVar11 = &base_long;
    }
  }
  else {
    paVar14 = &base_uint;
    paVar11 = &base_int;
  }
  switch(typestr[local_58]) {
  case 'd':
    break;
  case 'e':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'q':
    goto switchD_00107688_caseD_65;
  case 'f':
    paVar11 = &base_double;
    break;
  case 'p':
    paVar8 = &base_path;
    paVar11 = &base_path_ref;
    goto LAB_001076f4;
  case 'r':
    paVar8 = &base_catstring;
    paVar11 = &base_catstring_ref;
    goto LAB_001076f4;
  case 's':
    paVar8 = &base_string;
    paVar11 = &base_string_ref;
    goto LAB_001076f4;
  case 't':
    paVar11 = &base_timeval;
    break;
  case 'u':
    paVar11 = paVar14;
    break;
  case 'v':
    paVar8 = &base_version;
    paVar11 = &base_version_ref;
LAB_001076f4:
    if (local_54 == 0) {
      paVar11 = paVar8;
    }
    break;
  default:
    if (typestr[local_58] != 'D') goto switchD_00107688_caseD_65;
    paVar11 = &base_date;
  }
  *local_48 = local_58 + 1;
  return paVar11;
}

Assistant:

static adiak_datatype_t *parse_typestr_helper(const char *typestr, int typestr_start, int typestr_end, int is_reference,
                                       va_list *ap, int *new_typestr_start)

{
   adiak_datatype_t *t = NULL;
   int cur = typestr_start;
   int end_brace, i;
   int is_long = 0, is_longlong = 0;

   if (!typestr)
      goto error;
   if (typestr_start == typestr_end)
      goto error;

   while (isspace(typestr[cur]) || typestr[cur] == ',')
      cur++;
   if (typestr[cur] == '&') {
      is_reference = 1;
      cur++;
   }

   if (strchr("[{<(", typestr[cur])) {
      t = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
      memset(t, 0, sizeof(*t));
   }
   if (typestr[cur] == '{' || typestr[cur] == '[') {
      end_brace = find_end_brace(typestr, typestr[cur] == '{' ? '}' : ']',
                                 cur, typestr_end);
      if (end_brace == -1)
         goto error;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->dtype = typestr[cur] == '{' ? adiak_list : adiak_set;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '<') {
      end_brace = find_end_brace(typestr, '>', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_range;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_elements = (is_reference ? 0 : 2);
      t->num_ref_elements = (is_reference ? 2 : 0);
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '(') {
      end_brace = find_end_brace(typestr, ')', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_tuple;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->num_subtypes = num_elements;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *) * t->num_subtypes);
      memset(t->subtype, 0, sizeof(adiak_datatype_t *) * t->num_subtypes);
      cur++;
      for (i = 0; i < t->num_subtypes; i++) {
         t->subtype[i] = parse_typestr_helper(typestr, cur, end_brace, is_reference, ap, &cur);
         if (!t->subtype[i])
            goto error;
      }
   }
   else if (typestr[cur] == '%') {
      cur++;
      if (typestr[cur] == 'l') {
         is_long = 1;
         cur++;
         if (typestr[cur] == 'l') {
            is_longlong = 1;
            cur++;
         }
      }
      switch (typestr[cur]) {
         case 'd':
            t = is_long ? (is_longlong ? &base_longlong  : &base_long)  : &base_int;
            break;
         case 'u':
            t = is_long ? (is_longlong ? &base_ulonglong : &base_ulong) : &base_uint;
            break;
         case 'f':
            t = &base_double;
            break;
         case 'D':
            t = &base_date;
            break;
         case 't':
            t = &base_timeval;
            break;
         case 'v':
            t = (is_reference ? &base_version_ref : &base_version);
            break;
         case 's':
            t = (is_reference ? &base_string_ref : &base_string);
            break;
         case 'r':
            t = (is_reference ? &base_catstring_ref : &base_catstring);
            break;
         case 'p':
            t = (is_reference ? &base_path_ref : &base_path);
            break;
         default:
            goto error;
      }
      cur++;
      *new_typestr_start = cur;
      goto done;
   }

  done:
   return t;
  error:
   if (t)
      free_adiak_type(t);
   return NULL;
}